

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

int Ssw_MatchingCountUnmached(Aig_Man_t *p)

{
  void *pvVar1;
  uint uVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) &&
       ((uVar2 = *(uint *)((long)pvVar1 + 0x18) & 7, uVar2 == 2 || (uVar2 - 5 < 2)))) {
      iVar3 = iVar3 + (uint)(*(long *)((long)pvVar1 + 0x28) == 0);
    }
  }
  return iVar3;
}

Assistant:

int Ssw_MatchingCountUnmached( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        Counter++;
    }
    return Counter;
}